

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerFrameDisplayCheck(Lowerer *this,Instr *instr)

{
  uint uVar1;
  Instr *pIVar2;
  Instr *insertBeforeInstr;
  long *plVar3;
  code *pcVar4;
  Bucket<unsigned_int> *this_00;
  bool bVar5;
  uint32 uVar6;
  uint32 offset;
  Opnd *pOVar7;
  AddrOpnd *pAVar8;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar9;
  IntConstOpnd *pIVar10;
  undefined4 *puVar11;
  Type_conflict node;
  Type *pTVar12;
  RegOpnd *baseOpnd_00;
  Instr *instr_00;
  Instr *instrHelper;
  IntConstOpnd *slotIdOpnd_1;
  RegOpnd *slotArrayOpnd;
  IndirOpnd *indirOpnd_1;
  uint32 slotId;
  Bucket<unsigned_int> *bucket;
  Iterator __iter;
  uint _iterHash;
  IntConstOpnd *slotIdOpnd;
  IndirOpnd *indirOpnd;
  uint32 frameDisplayOffset;
  RegOpnd *envOpnd;
  LabelInstr *continueLabel;
  LabelInstr *errorLabel;
  FrameDisplayCheckRecord *record;
  AddrOpnd *addrOpnd;
  Instr *insertInstr;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar2 = instr->m_prev;
  insertBeforeInstr = instr->m_next;
  pOVar7 = IR::Instr::UnlinkSrc2(instr);
  pAVar8 = IR::Opnd::AsAddrOpnd(pOVar7);
  plVar3 = (long *)pAVar8->m_address;
  continueLabel = (LabelInstr *)0x0;
  envOpnd = (RegOpnd *)0x0;
  pOVar7 = IR::Instr::GetDst(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(pOVar7);
  uVar6 = Js::FrameDisplay::GetOffsetOfScopes();
  if (((int)plVar3[1] != -1) && (uVar6 >> 3 < *(uint *)(plVar3 + 1))) {
    continueLabel = IR::LabelInstr::New(Label,this->m_func,true);
    envOpnd = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,false);
    offset = Js::FrameDisplay::GetOffsetOfLength();
    pIVar9 = IR::IndirOpnd::New(baseOpnd,offset,TyUint16,this->m_func,true);
    pIVar10 = IR::IntConstOpnd::New
                        ((ulong)((int)plVar3[1] - (uVar6 >> 3)),TyUint16,this->m_func,false);
    InsertCompareBranch(this,&pIVar9->super_Opnd,&pIVar10->super_Opnd,BrLe_A,true,continueLabel,
                        insertBeforeInstr,false);
  }
  if (*plVar3 != 0) {
    for (__iter.current._4_4_ = 0; __iter.current._4_4_ < *(uint *)(*plVar3 + 8);
        __iter.current._4_4_ = __iter.current._4_4_ + 1) {
      _bucket = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::GetIterator
                          ((SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)
                           (*(long *)(*plVar3 + 0x10) + (ulong)__iter.current._4_4_ * 0x10));
      while( true ) {
        if (__iter.list == (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)0x0
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        this_00 = bucket;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar5 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)
                           this_00,node);
        if (bVar5) break;
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        pTVar12 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&bucket);
        uVar1 = pTVar12->element;
        if ((uVar1 != 0xffffffff) && (2 < uVar1)) {
          if (continueLabel == (LabelInstr *)0x0) {
            continueLabel = IR::LabelInstr::New(Label,this->m_func,true);
            envOpnd = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,false);
          }
          pIVar9 = IR::IndirOpnd::New(baseOpnd,pTVar12->value << 3,TyVar,this->m_func,true);
          baseOpnd_00 = IR::RegOpnd::New(TyVar,this->m_func);
          InsertMove(&baseOpnd_00->super_Opnd,&pIVar9->super_Opnd,insertBeforeInstr,true);
          pIVar9 = IR::IndirOpnd::New(baseOpnd_00,0,TyVar,this->m_func,true);
          pIVar10 = IR::IntConstOpnd::New((ulong)(uVar1 - 2),TyUint32,this->m_func,false);
          InsertCompareBranch(this,&pIVar9->super_Opnd,&pIVar10->super_Opnd,BrLe_A,true,
                              continueLabel,insertBeforeInstr,false);
        }
      }
    }
  }
  if (continueLabel != (LabelInstr *)0x0) {
    InsertBranch(Br,(LabelInstr *)envOpnd,insertBeforeInstr);
    IR::Instr::InsertBefore(insertBeforeInstr,&continueLabel->super_Instr);
    instr_00 = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(insertBeforeInstr,instr_00);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_00,HelperOp_FatalInternalError,(LabelInstr *)0x0,(Opnd *)0x0
               ,(PropertySymOpnd *)0x0,false);
    IR::Instr::InsertBefore(insertBeforeInstr,(Instr *)envOpnd);
  }
  LowererMD::ChangeToAssign(instr);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerFrameDisplayCheck(IR::Instr * instr)
{
    IR::Instr *instrPrev = instr->m_prev;
    IR::Instr *insertInstr = instr->m_next;
    IR::AddrOpnd *addrOpnd = instr->UnlinkSrc2()->AsAddrOpnd();
    FrameDisplayCheckRecord *record = (FrameDisplayCheckRecord*)addrOpnd->m_address;

    IR::LabelInstr *errorLabel = nullptr;
    IR::LabelInstr *continueLabel = nullptr;
    IR::RegOpnd *envOpnd = instr->GetDst()->AsRegOpnd();
    uint32 frameDisplayOffset = Js::FrameDisplay::GetOffsetOfScopes()/sizeof(Js::Var);

    if (record->slotId != (uint32)-1 && record->slotId > frameDisplayOffset)
    {
        // Check that the frame display has enough scopes in it to satisfy the code.
        errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                       Js::FrameDisplay::GetOffsetOfLength(),
                                                       TyUint16, m_func, true);

        IR::IntConstOpnd *slotIdOpnd = IR::IntConstOpnd::New(record->slotId - frameDisplayOffset, TyUint16, m_func);
        InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
    }

    if (record->table)
    {
        // Check the size of each of the slot arrays in the scope chain.
        FOREACH_HASHTABLE_ENTRY(uint32, bucket, record->table)
        {
            uint32 slotId = bucket.element;
            if (slotId != (uint32)-1 && slotId > Js::ScopeSlots::FirstSlotIndex)
            {
                if (errorLabel == nullptr)
                {
                    errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                    continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
                }

                IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                               bucket.value * sizeof(Js::Var),
                                                               TyVar, m_func, true);
                IR::RegOpnd * slotArrayOpnd = IR::RegOpnd::New(TyVar, m_func);
                InsertMove(slotArrayOpnd, indirOpnd, insertInstr);

                indirOpnd = IR::IndirOpnd::New(slotArrayOpnd,
                                               Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
                                               TyVar, m_func, true);

                IR::IntConstOpnd * slotIdOpnd = IR::IntConstOpnd::New(slotId - Js::ScopeSlots::FirstSlotIndex,
                                                                      TyUint32, m_func);
                InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
            }
        }
        NEXT_HASHTABLE_ENTRY;
    }

    if (errorLabel)
    {
        InsertBranch(Js::OpCode::Br, continueLabel, insertInstr);

        insertInstr->InsertBefore(errorLabel);
        IR::Instr * instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
        insertInstr->InsertBefore(instrHelper);
        m_lowererMD.ChangeToHelperCall(instrHelper, IR::HelperOp_FatalInternalError);
        insertInstr->InsertBefore(continueLabel);
    }

    m_lowererMD.ChangeToAssign(instr);

    return instrPrev;
}